

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall
cornerstone::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  allocator<char> *__a;
  resp_msg *in_RSI;
  long in_RDI;
  ptr<snapshot> nil_snp;
  ptr<snapshot_sync_ctx> sync_ctx;
  lock_guard<std::mutex> guard;
  ptr<peer> p;
  bool need_to_catchup;
  peer_itor it;
  shared_lock<std::shared_timed_mutex> rlock;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  peer *in_stack_fffffffffffffcc0;
  ptr<snapshot> *in_stack_fffffffffffffcc8;
  peer *in_stack_fffffffffffffcd0;
  allocator<char> *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  bool local_2ea;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  raft_server *in_stack_fffffffffffffda8;
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  strfmt<100> local_208;
  string local_198 [55];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [79];
  bool local_e9;
  undefined4 local_e8;
  allocator<char> local_e1;
  strfmt<100> local_e0;
  string local_70 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_50 [3]
  ;
  int32 local_34;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_30;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_28 [3]
  ;
  resp_msg *local_10;
  
  local_10 = in_RSI;
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffcc0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  local_34 = msg_base::get_src(&local_10->super_msg_base);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
       ::find((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),(key_type *)0x1df608)
  ;
  std::__detail::
  _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
  _Node_const_iterator
            ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              *)in_stack_fffffffffffffcc0,
             (_Node_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
              *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
       ::end((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  bVar1 = std::__detail::operator==(local_28,local_50);
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1df685);
    strfmt<100>::strfmt(&local_e0,"the response is from an unkonw peer %d");
    msg_base::get_src(&local_10->super_msg_base);
    strfmt<100>::fmt<int>((strfmt<100> *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    (*peVar8->_vptr_logger[3])(peVar8,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_e1);
    local_e8 = 1;
  }
  else {
    local_e9 = true;
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>::
    operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false,_false>
                *)0x1df7c7);
    std::shared_ptr<cornerstone::peer>::shared_ptr
              ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffcc0,
               (shared_ptr<cornerstone::peer> *)
               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    bVar1 = resp_msg::get_accepted(local_10);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1df80e);
      peer::get_lock(peVar3);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_fffffffffffffcc0,
                 (mutex_type *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1df844);
      peer::get_snapshot_sync_ctx
                ((peer *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      bVar1 = std::operator==((shared_ptr<cornerstone::snapshot_sync_ctx> *)
                              in_stack_fffffffffffffcc0,
                              (nullptr_t)
                              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
      if (bVar1) {
        peVar8 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1df884);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
        (*peVar8->_vptr_logger[3])(peVar8,local_138);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator(&local_139);
        local_e9 = false;
      }
      else {
        uVar4 = resp_msg::get_next_idx(local_10);
        peVar5 = std::
                 __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1df9a0);
        snapshot_sync_ctx::get_snapshot(peVar5);
        peVar6 = std::
                 __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1df9bf);
        uVar7 = snapshot::size(peVar6);
        if (uVar4 < uVar7) {
          peVar8 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfc8f);
          strfmt<100>::strfmt(&local_208,"continue to sync snapshot at offset %llu");
          __a = (allocator<char> *)resp_msg::get_next_idx(local_10);
          strfmt<100>::fmt<unsigned_long>
                    ((strfmt<100> *)in_stack_fffffffffffffcc0,
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd00,(char *)peVar8,__a);
          (*peVar8->_vptr_logger[2])(peVar8,local_198);
          std::__cxx11::string::~string(local_198);
          std::allocator<char>::~allocator(&local_209);
          peVar5 = std::
                   __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfd41);
          uVar4 = resp_msg::get_next_idx(local_10);
          snapshot_sync_ctx::set_offset(peVar5,uVar4);
        }
        else {
          peVar8 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1df9fe);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
          (*peVar8->_vptr_logger[2])(peVar8,local_160);
          std::__cxx11::string::~string(local_160);
          std::allocator<char>::~allocator(&local_161);
          std::shared_ptr<cornerstone::snapshot>::shared_ptr
                    ((shared_ptr<cornerstone::snapshot> *)0x1dfa7b);
          peVar3 = std::
                   __shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfa88);
          peVar5 = std::
                   __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfa9d);
          snapshot_sync_ctx::get_snapshot(peVar5);
          peVar6 = std::
                   __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfabc);
          uVar4 = snapshot::get_last_log_idx(peVar6);
          peer::set_next_log_idx(peVar3,uVar4 + 1);
          peVar3 = std::
                   __shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfaef);
          peVar5 = std::
                   __shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfb01);
          snapshot_sync_ctx::get_snapshot(peVar5);
          peVar6 = std::
                   __shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfb1a);
          uVar4 = snapshot::get_last_log_idx(peVar6);
          peer::set_matched_idx(peVar3,uVar4);
          std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1dfb47);
          peer::set_snapshot_in_sync(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1dfb66);
          bVar1 = peer::clear_pending_commit(in_stack_fffffffffffffcc0);
          local_2ea = true;
          if (!bVar1) {
            uVar4 = resp_msg::get_next_idx(local_10);
            peVar9 = std::
                     __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1dfbad);
            iVar2 = (*peVar9->_vptr_log_store[2])();
            local_2ea = uVar4 < CONCAT44(extraout_var,iVar2);
          }
          local_e9 = local_2ea;
          std::shared_ptr<cornerstone::snapshot>::~shared_ptr
                    ((shared_ptr<cornerstone::snapshot> *)0x1dfbee);
        }
      }
      std::shared_ptr<cornerstone::snapshot_sync_ctx>::~shared_ptr
                ((shared_ptr<cornerstone::snapshot_sync_ctx> *)0x1dfdc2);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1dfdcf);
    }
    else {
      in_stack_fffffffffffffcc0 =
           (peer *)std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1dfe07);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      (*(code *)(((in_stack_fffffffffffffcc0->config_).
                  super___shared_ptr<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                endpoint_).field_2._M_allocated_capacity)(in_stack_fffffffffffffcc0,local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator(&local_231);
    }
    if ((*(int *)(in_RDI + 0x128) == 3) && ((local_e9 & 1U) != 0)) {
      std::__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<cornerstone::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffcc0);
      request_append_entries
                (in_stack_fffffffffffffda8,
                 (peer *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    }
    std::shared_ptr<cornerstone::peer>::~shared_ptr((shared_ptr<cornerstone::peer> *)0x1dfefc);
    local_e8 = 0;
  }
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffcc0);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp)
{
    read_lock(peers_lock_);
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end())
    {
        l_->info(sstrfmt("the response is from an unkonw peer %d").fmt(resp.get_src()));
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced, continue to send appendEntries to
    // this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted())
    {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nilptr)
        {
            l_->info("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;
        }
        else
        {
            if (resp.get_next_idx() >= sync_ctx->get_snapshot()->size())
            {
                l_->debug("snapshot sync is done");
                ptr<snapshot> nil_snp;
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                p->set_snapshot_in_sync(nil_snp);
                need_to_catchup = p->clear_pending_commit() || resp.get_next_idx() < log_store_->next_slot();
            }
            else
            {
                l_->debug(sstrfmt("continue to sync snapshot at offset %llu").fmt(resp.get_next_idx()));
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }
    }
    else
    {
        l_->info("peer declines to install the snapshot, will retry");
    }

    // This may not be a leader anymore, such as the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup)
    {
        request_append_entries(*p);
    }
}